

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O3

void __thiscall CAPSFile::~CAPSFile(CAPSFile *this)

{
  ~CAPSFile(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

CAPSFile::~CAPSFile()
{
   CAPSFile::Clear();
}